

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forwardDilation_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  undefined4 *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  int j_1;
  float *ptr_1;
  int i_1;
  float *outptr_1;
  int c_1;
  Option opt_g;
  int j;
  float *ptr;
  int i;
  float *outptr;
  int c;
  int inner_outh;
  int inner_outw;
  int inner_h;
  int inner_w;
  int y;
  int x;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  int outh;
  int outw;
  int kernel_extent;
  int dilation;
  int stride;
  int kernel_size;
  size_t elemsize;
  int h;
  int w;
  Mat *in_stack_fffffffffffffd50;
  Mat *in_stack_fffffffffffffd58;
  float *in_stack_fffffffffffffd60;
  long in_stack_fffffffffffffd68;
  Mat *in_stack_fffffffffffffd70;
  int local_26c;
  Mat local_268;
  float *local_228;
  int local_21c;
  Mat local_218;
  Mat *local_1d8;
  int local_1cc;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  Allocator *pAStack_1c0;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined8 local_1a8;
  int local_19c;
  Mat local_198;
  long local_158;
  int local_14c;
  Mat local_148;
  float *local_108;
  int local_fc;
  undefined4 local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  Mat local_d0;
  Mat local_90;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  undefined8 local_38;
  int local_30;
  int local_2c;
  undefined4 *local_28;
  undefined8 local_20;
  long local_18;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_38 = *(undefined8 *)(in_RSI + 0x10);
  local_3c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc);
  local_40 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc);
  local_44 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4);
  local_48 = local_44 * (local_3c + -1) + 1;
  local_4c = (local_2c - local_48) / local_40 + 1;
  local_50 = (local_30 - local_48) / local_40 + 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  Mat::create(in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
              (int)in_stack_fffffffffffffd68,(int)((ulong)in_stack_fffffffffffffd60 >> 0x20),
              (size_t)in_stack_fffffffffffffd58,(Allocator *)in_stack_fffffffffffffd50);
  bVar1 = Mat::empty(in_stack_fffffffffffffd50);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    Mat::Mat(&local_90);
    Mat::Mat(&local_d0);
    for (local_e0 = 0; local_e0 < local_44; local_e0 = local_e0 + 1) {
      for (local_e4 = 0; local_e4 < local_44; local_e4 = local_e4 + 1) {
        local_e8 = ((local_2c - local_e4) + -1 + local_44) / local_44;
        local_ec = ((local_30 - local_e0) + -1 + local_44) / local_44;
        local_f0 = (local_e8 - local_3c) / local_40 + 1;
        local_f4 = (local_ec - local_3c) / local_40 + 1;
        Mat::create(in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                    (int)in_stack_fffffffffffffd68,(int)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                    (size_t)in_stack_fffffffffffffd58,(Allocator *)in_stack_fffffffffffffd50);
        bVar1 = Mat::empty(in_stack_fffffffffffffd50);
        if (bVar1) {
          local_4 = -100;
          goto LAB_0014bf04;
        }
        Mat::create(in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                    (int)in_stack_fffffffffffffd68,(int)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                    (size_t)in_stack_fffffffffffffd58,(Allocator *)in_stack_fffffffffffffd50);
        bVar1 = Mat::empty(in_stack_fffffffffffffd50);
        if (bVar1) {
          local_4 = -100;
          goto LAB_0014bf04;
        }
        for (local_fc = 0; local_fc < *(int *)(local_18 + 0x34); local_fc = local_fc + 1) {
          Mat::channel(in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_148);
          Mat::~Mat((Mat *)0x14ba36);
          local_108 = pfVar2;
          for (local_14c = 0; local_14c < local_ec; local_14c = local_14c + 1) {
            Mat::channel(in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
            in_stack_fffffffffffffd70 = (Mat *)Mat::operator_cast_to_float_(&local_198);
            in_stack_fffffffffffffd68 =
                 (long)&in_stack_fffffffffffffd70->data +
                 (long)local_e4 * 4 +
                 (long)(local_e0 * local_2c) * 4 + (long)(local_44 * local_14c * local_2c) * 4;
            Mat::~Mat((Mat *)0x14baf4);
            for (local_19c = 0; local_19c < local_e8; local_19c = local_19c + 1) {
              local_108[local_19c] =
                   *(float *)(in_stack_fffffffffffffd68 + (long)(local_19c * local_44) * 4);
            }
            local_108 = local_108 + local_e8;
            local_158 = in_stack_fffffffffffffd68;
          }
        }
        local_1a8 = *(undefined8 *)(local_28 + 8);
        local_1c8 = *local_28;
        uStack_1c4 = local_28[1];
        local_1b8 = local_28[4];
        uStack_1b4 = local_28[5];
        uStack_1b0 = local_28[6];
        uStack_1ac = local_28[7];
        pAStack_1c0 = local_d0.allocator;
        (**(code **)(*(long *)in_RDI[0x16] + 0x38))
                  ((long *)in_RDI[0x16],&local_90,&local_d0,&local_1c8);
        for (local_1cc = 0; local_1cc < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
            local_1cc = local_1cc + 1) {
          Mat::channel(in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
          in_stack_fffffffffffffd60 = Mat::operator_cast_to_float_(&local_218);
          in_stack_fffffffffffffd58 =
               (Mat *)(in_stack_fffffffffffffd60 + (long)(local_e0 * local_4c) + (long)local_e4);
          Mat::~Mat((Mat *)0x14bd08);
          local_1d8 = in_stack_fffffffffffffd58;
          for (local_21c = 0; local_21c < local_f4; local_21c = local_21c + 1) {
            Mat::channel(in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
            in_stack_fffffffffffffd50 = (Mat *)Mat::operator_cast_to_float_(&local_268);
            pfVar2 = (float *)((long)&in_stack_fffffffffffffd50->data +
                              (long)(local_21c * local_f0) * 4);
            Mat::~Mat((Mat *)0x14bd8c);
            for (local_26c = 0; local_26c < local_f0; local_26c = local_26c + 1) {
              *(float *)((long)&local_1d8->data + (long)(local_26c * local_44) * 4) =
                   pfVar2[local_26c];
            }
            local_1d8 = (Mat *)((long)&local_1d8->data + (long)(local_44 * local_4c) * 4);
            local_228 = pfVar2;
          }
        }
      }
    }
    if (in_RDI[1] != 0) {
      (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
    }
    local_4 = 0;
LAB_0014bf04:
    local_f8 = 1;
    Mat::~Mat((Mat *)0x14bf11);
    Mat::~Mat((Mat *)0x14bf1e);
  }
  return local_4;
}

Assistant:

int Convolution_x86::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}